

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_traits.h
# Opt level: O2

void cppcms::details::
     archive_save_container<std::map<std::__cxx11::string,std::vector<int,std::allocator<int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                *v,archive *a)

{
  _Base_ptr p_Var1;
  
  archive_traits<unsigned_long,_void>::save((v->_M_t)._M_impl.super__Rb_tree_header._M_node_count,a)
  ;
  for (p_Var1 = (v->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(v->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    archive_traits<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_void>
    ::save((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
            *)(p_Var1 + 1),a);
  }
  return;
}

Assistant:

void archive_save_container(T const &v,archive &a)
		{
			typename T::const_iterator it;
			typedef typename T::value_type value_type;
			size_t n=v.size();
			archive_traits<size_t>::save(n,a);
			for(it=v.begin();it!=v.end();++it) {
				archive_traits<value_type>::save(*it,a);
			}
		}